

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

string * units::generateUnitSequence(string *__return_storage_ptr__,double mux,string *seq)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  bool numOnly;
  bool numOnly_00;
  bool numOnly_01;
  bool numOnly_02;
  bool numOnly_03;
  bool numOnly_04;
  bool numOnly_05;
  bool numOnly_06;
  bool numOnly_07;
  bool numOnly_08;
  bool numOnly_09;
  bool numOnly_10;
  bool numOnly_11;
  bool numOnly_12;
  bool numOnly_13;
  bool numOnly_14;
  bool numOnly_15;
  bool numOnly_16;
  double dVar5;
  string local_358;
  string local_338;
  string local_318;
  string local_2f8;
  string local_2d8;
  string local_2b8;
  string local_298;
  string local_278;
  string local_258;
  string local_238;
  string local_218;
  undefined1 local_1f8 [8];
  string muxstr;
  int pw;
  int offset;
  ulong local_190;
  size_type mloc;
  ulong local_168;
  size_type pwerloc;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  string local_c0;
  string local_90;
  undefined1 local_70 [8];
  string muxstr_1;
  size_type pwerloc_1;
  int pw_1;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  undefined8 local_30;
  byte local_21;
  string *psStack_20;
  bool noPrefix;
  string *seq_local;
  double mux_local;
  
  local_21 = 0;
  psStack_20 = seq;
  seq_local = (string *)mux;
  mux_local = (double)__return_storage_ptr__;
  iVar2 = std::__cxx11::string::compare((ulong)seq,0,(char *)0x3);
  if (iVar2 == 0) {
    if ((double)seq_local <= 0.1) {
      std::__cxx11::string::replace((ulong)seq,0,(char *)0x3);
      seq_local = (string *)((double)seq_local * 1000.0);
    }
  }
  else {
    iVar2 = std::__cxx11::string::compare((ulong)seq,0,(char *)0x4);
    if (iVar2 == 0) {
      if (100.0 < (double)seq_local) {
        std::__cxx11::string::replace((ulong)seq,0,(char *)0x4);
        seq_local = (string *)((double)seq_local / 1000.0);
      }
    }
    else {
      iVar2 = std::__cxx11::string::compare((ulong)seq,0,(char *)0x5);
      if (iVar2 == 0) {
        if ((double)seq_local <= 100.0) {
          local_21 = 1;
        }
        else {
          std::__cxx11::string::replace((ulong)seq,0,(char *)0x5);
          seq_local = (string *)((double)seq_local / 1000.0);
        }
      }
      else {
        iVar2 = std::__cxx11::string::compare((ulong)seq,0,(char *)0x2);
        if (iVar2 == 0) {
          if (0.1 < (double)seq_local) {
            local_21 = 1;
          }
          else {
            uVar3 = std::__cxx11::string::size();
            if ((uVar3 < 4) ||
               (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)seq), *pcVar4 != '^')) {
              std::__cxx11::string::replace((ulong)seq,0,(char *)0x2);
              seq_local = (string *)((double)seq_local * 1000.0);
            }
            else {
              local_21 = 1;
            }
          }
        }
      }
    }
  }
  if (((double)seq_local != 1.0) || (NAN((double)seq_local))) {
    pcVar4 = (char *)std::__cxx11::string::front();
    if (*pcVar4 == '/') {
      pwerloc_1._4_4_ = 1;
      muxstr_1.field_2._8_8_ = std::__cxx11::string::find_first_of((char)seq,0x5e);
      if (muxstr_1.field_2._8_8_ != -1) {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)seq);
        pwerloc_1._4_4_ = *pcVar4 + -0x30;
      }
      std::__cxx11::string::string((string *)local_70);
      if (pwerloc_1._4_4_ == 1) {
        getMultiplierString_abi_cxx11_
                  (&local_90,(units *)(ulong)(local_21 & 1),1.0 / (double)seq_local,numOnly);
        std::__cxx11::string::operator=((string *)local_70,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        pcVar4 = (char *)std::__cxx11::string::front();
        bVar1 = isNumericalStartCharacter(*pcVar4);
        if (bVar1) {
          getMultiplierString_abi_cxx11_(&local_c0,(units *)0x1,(double)seq_local,numOnly_00);
          std::__cxx11::string::operator=((string *)local_70,(string *)&local_c0);
          std::__cxx11::string::~string((string *)&local_c0);
        }
        else {
          std::__cxx11::string::insert((ulong)seq,(string *)0x1);
          std::__cxx11::string::operator=((string *)local_70,"1");
        }
      }
      else if (pwerloc_1._4_4_ == 2) {
        dVar5 = sqrt(1.0 / (double)seq_local);
        getMultiplierString_abi_cxx11_(&local_e0,(units *)(ulong)(local_21 & 1),dVar5,numOnly_01);
        std::__cxx11::string::operator=((string *)local_70,(string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
        pcVar4 = (char *)std::__cxx11::string::front();
        bVar1 = isNumericalStartCharacter(*pcVar4);
        if (bVar1) {
          getMultiplierString_abi_cxx11_(&local_100,(units *)0x1,(double)seq_local,numOnly_02);
          std::__cxx11::string::operator=((string *)local_70,(string *)&local_100);
          std::__cxx11::string::~string((string *)&local_100);
        }
        else {
          std::__cxx11::string::insert((ulong)seq,(string *)0x1);
          std::__cxx11::string::operator=((string *)local_70,"1");
        }
      }
      else if (pwerloc_1._4_4_ == 3) {
        dVar5 = cbrt(1.0 / (double)seq_local);
        getMultiplierString_abi_cxx11_(&local_120,(units *)(ulong)(local_21 & 1),dVar5,numOnly_03);
        std::__cxx11::string::operator=((string *)local_70,(string *)&local_120);
        std::__cxx11::string::~string((string *)&local_120);
        pcVar4 = (char *)std::__cxx11::string::front();
        bVar1 = isNumericalStartCharacter(*pcVar4);
        if (bVar1) {
          getMultiplierString_abi_cxx11_(&local_140,(units *)0x1,(double)seq_local,numOnly_04);
          std::__cxx11::string::operator=((string *)local_70,(string *)&local_140);
          std::__cxx11::string::~string((string *)&local_140);
        }
        else {
          std::__cxx11::string::insert((ulong)seq,(string *)0x1);
          std::__cxx11::string::operator=((string *)local_70,"1");
        }
      }
      else {
        getMultiplierString_abi_cxx11_((string *)&pwerloc,(units *)0x1,(double)seq_local,numOnly);
        std::__cxx11::string::operator=((string *)local_70,(string *)&pwerloc);
        std::__cxx11::string::~string((string *)&pwerloc);
      }
      std::operator+(__return_storage_ptr__,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                     seq);
      std::__cxx11::string::~string((string *)local_70);
    }
    else {
      local_168 = std::__cxx11::string::find_first_of((char)seq,0x5e);
      if (local_168 == 0xffffffffffffffff) {
        getMultiplierString_abi_cxx11_
                  ((string *)&mloc,(units *)(ulong)(local_21 & 1),(double)seq_local,numOnly_05);
        std::operator+(__return_storage_ptr__,(string *)&mloc,seq);
        std::__cxx11::string::~string((string *)&mloc);
      }
      else {
        local_190 = std::__cxx11::string::find_first_of((char *)seq,0x1d2243);
        if (local_190 < local_168) {
          getMultiplierString_abi_cxx11_
                    ((string *)&pw,(units *)(ulong)(local_21 & 1),(double)seq_local,numOnly_06);
          std::operator+(__return_storage_ptr__,(string *)&pw,seq);
          std::__cxx11::string::~string((string *)&pw);
        }
        else {
          std::__cxx11::string::operator[]((ulong)seq);
          std::__cxx11::string::substr
                    ((ulong)(&muxstr.field_2._M_allocated_capacity + 1),(ulong)seq);
          iVar2 = std::__cxx11::stoi((string *)(&muxstr.field_2._M_allocated_capacity + 1),
                                     (size_t *)0x0,10);
          std::__cxx11::string::~string((string *)(muxstr.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)local_1f8);
          switch(iVar2) {
          default:
            getMultiplierString_abi_cxx11_(&local_358,(units *)0x1,(double)seq_local,numOnly_07);
            std::__cxx11::string::operator=((string *)local_1f8,(string *)&local_358);
            std::__cxx11::string::~string((string *)&local_358);
            break;
          case 2:
            dVar5 = sqrt((double)seq_local);
            getMultiplierString_abi_cxx11_
                      (&local_2d8,(units *)(ulong)(local_21 & 1),dVar5,numOnly_13);
            std::__cxx11::string::operator=((string *)local_1f8,(string *)&local_2d8);
            std::__cxx11::string::~string((string *)&local_2d8);
            pcVar4 = (char *)std::__cxx11::string::front();
            bVar1 = isNumericalStartCharacter(*pcVar4);
            if (bVar1) {
              getMultiplierString_abi_cxx11_(&local_2f8,(units *)0x1,(double)seq_local,numOnly_14);
              std::__cxx11::string::operator=((string *)local_1f8,(string *)&local_2f8);
              std::__cxx11::string::~string((string *)&local_2f8);
            }
            break;
          case 3:
            dVar5 = cbrt((double)seq_local);
            getMultiplierString_abi_cxx11_
                      (&local_318,(units *)(ulong)(local_21 & 1),dVar5,numOnly_15);
            std::__cxx11::string::operator=((string *)local_1f8,(string *)&local_318);
            std::__cxx11::string::~string((string *)&local_318);
            pcVar4 = (char *)std::__cxx11::string::front();
            bVar1 = isNumericalStartCharacter(*pcVar4);
            if (bVar1) {
              getMultiplierString_abi_cxx11_(&local_338,(units *)0x1,(double)seq_local,numOnly_16);
              std::__cxx11::string::operator=((string *)local_1f8,(string *)&local_338);
              std::__cxx11::string::~string((string *)&local_338);
            }
            break;
          case -3:
            dVar5 = cbrt(1.0 / (double)seq_local);
            getMultiplierString_abi_cxx11_
                      (&local_298,(units *)(ulong)(local_21 & 1),dVar5,numOnly_11);
            std::__cxx11::string::operator=((string *)local_1f8,(string *)&local_298);
            std::__cxx11::string::~string((string *)&local_298);
            pcVar4 = (char *)std::__cxx11::string::front();
            bVar1 = isNumericalStartCharacter(*pcVar4);
            if (bVar1) {
              getMultiplierString_abi_cxx11_(&local_2b8,(units *)0x1,(double)seq_local,numOnly_12);
              std::__cxx11::string::operator=((string *)local_1f8,(string *)&local_2b8);
              std::__cxx11::string::~string((string *)&local_2b8);
            }
            break;
          case -2:
            dVar5 = sqrt(1.0 / (double)seq_local);
            getMultiplierString_abi_cxx11_
                      (&local_258,(units *)(ulong)(local_21 & 1),dVar5,numOnly_09);
            std::__cxx11::string::operator=((string *)local_1f8,(string *)&local_258);
            std::__cxx11::string::~string((string *)&local_258);
            pcVar4 = (char *)std::__cxx11::string::front();
            bVar1 = isNumericalStartCharacter(*pcVar4);
            if (bVar1) {
              getMultiplierString_abi_cxx11_(&local_278,(units *)0x1,(double)seq_local,numOnly_10);
              std::__cxx11::string::operator=((string *)local_1f8,(string *)&local_278);
              std::__cxx11::string::~string((string *)&local_278);
            }
            break;
          case -1:
            getMultiplierString_abi_cxx11_
                      (&local_218,(units *)(ulong)(local_21 & 1),1.0 / (double)seq_local,numOnly_07)
            ;
            std::__cxx11::string::operator=((string *)local_1f8,(string *)&local_218);
            std::__cxx11::string::~string((string *)&local_218);
            pcVar4 = (char *)std::__cxx11::string::front();
            bVar1 = isNumericalStartCharacter(*pcVar4);
            if (bVar1) {
              getMultiplierString_abi_cxx11_(&local_238,(units *)0x1,(double)seq_local,numOnly_08);
              std::__cxx11::string::operator=((string *)local_1f8,(string *)&local_238);
              std::__cxx11::string::~string((string *)&local_238);
            }
          }
          std::operator+(__return_storage_ptr__,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_1f8,seq);
          std::__cxx11::string::~string((string *)local_1f8);
        }
      }
    }
  }
  else {
    pcVar4 = (char *)std::__cxx11::string::front();
    if (*pcVar4 == '/') {
      local_38._M_current = (char *)std::__cxx11::string::begin();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_30,&local_38);
      std::__cxx11::string::insert(seq,local_30,0x31);
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)seq);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string generateUnitSequence(double mux, std::string seq)
{
    bool noPrefix = false;
    // deal with a few common things
    if (seq.compare(0, 3, "m^3") == 0) {
        if (mux <= 0.1) {
            seq.replace(0, 3, "L");
            mux *= 1000.0;
        }
    } else if (seq.compare(0, 4, "m^-3") == 0) {
        if (mux > 100.0) {
            seq.replace(0, 4, "L^-1");
            mux /= 1000.0;
        }
    } else if (seq.compare(0, 5, "kg^-1") == 0) {
        if (mux > 100.0) {
            seq.replace(0, 5, "g^-1");
            mux /= 1000.0;
        } else {
            noPrefix = true;
        }
    } else if (seq.compare(0, 2, "kg") == 0) {
        if (mux <= 0.1) {
            if (seq.size() > 3 && seq[2] == '^') {
                noPrefix = true;
            } else {
                seq.replace(0, 2, "g");
                mux *= 1000.0;
            }
        } else {
            noPrefix = true;
        }
    }
    if (mux == 1.0) {
        if (seq.front() == '/') {
            seq.insert(seq.begin(), '1');
        }
        return seq;
    }
    if (seq.front() == '/') {
        int pw = 1;
        auto pwerloc = seq.find_first_of('^');
        if (pwerloc != std::string::npos) {
#ifdef UNITS_CONSTEXPR_IF_SUPPORTED
            if constexpr (
                detail::bitwidth::base_size == sizeof(std::uint32_t)) {
                pw = seq[pwerloc + 1] - '0';
            } else {
                if (seq.size() <= pwerloc + 2 ||
                    !isDigitCharacter(seq[pwerloc + 2])) {
                    pw = seq[pwerloc + 1] - '0';
                } else {
                    pw = 10;
                }
            }
#else
            if (detail::bitwidth::base_size == sizeof(std::uint32_t) ||
                seq.size() <= pwerloc + 2 ||
                !isDigitCharacter(seq[pwerloc + 2])) {
                pw = seq[pwerloc + 1] - '0';
            } else {
                pw = 10;
            }
#endif
        }
        std::string muxstr;
        switch (pw) {
            case 1:
                muxstr = getMultiplierString(1.0 / mux, noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            case 2:
                muxstr = getMultiplierString(std::sqrt(1.0 / mux), noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            case 3:
                muxstr = getMultiplierString(std::cbrt(1.0 / mux), noPrefix);
                if (isNumericalStartCharacter(muxstr.front())) {
                    muxstr = getMultiplierString(mux, true);
                } else {
                    seq.insert(1, muxstr);
                    muxstr = "1";
                }
                break;
            default:
                muxstr = getMultiplierString(mux, true);
        }
        return muxstr + seq;
    }
    auto pwerloc = seq.find_first_of('^');
    if (pwerloc == std::string::npos) {
        return getMultiplierString(mux, noPrefix) + seq;
    }
    auto mloc = seq.find_first_of("*/)");
    if (mloc < pwerloc) {
        return getMultiplierString(mux, noPrefix) + seq;
    }
    int offset = (seq[pwerloc + 1] != '(') ? 1 : 2;
    int pw = stoi(seq.substr(pwerloc + offset, mloc - pwerloc - offset + 1));
    std::string muxstr;
    switch (pw) {
        case -1:
            muxstr = getMultiplierString(1.0 / mux, noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case -2:
            muxstr = getMultiplierString(std::sqrt(1.0 / mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case -3:
            muxstr = getMultiplierString(std::cbrt(1.0 / mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case 2:
            muxstr = getMultiplierString(std::sqrt(mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        case 3:
            muxstr = getMultiplierString(std::cbrt(mux), noPrefix);
            if (isNumericalStartCharacter(muxstr.front())) {
                muxstr = getMultiplierString(mux, true);
            }
            break;
        default:
            muxstr = getMultiplierString(mux, true);
    }
    return muxstr + seq;
}